

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O2

void impl_GLSL_PushUniforms(void)

{
  MOJOSHADER_glProgram *pMVar1;
  
  pMVar1 = ctx->bound_program;
  if (pMVar1->uniform_count == 0) {
    __assert_fail("program->uniform_count > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                  ,0x25f,"void impl_GLSL_PushUniforms(void)");
  }
  if (pMVar1->vs_float4_loc != -1) {
    (*ctx->glUniform4fv)
              (pMVar1->vs_float4_loc,(GLsizei)pMVar1->vs_uniforms_float4_count,
               pMVar1->vs_uniforms_float4);
  }
  if (pMVar1->vs_int4_loc != -1) {
    (*ctx->glUniform4iv)
              (pMVar1->vs_int4_loc,(GLsizei)pMVar1->vs_uniforms_int4_count,pMVar1->vs_uniforms_int4)
    ;
  }
  if (pMVar1->vs_bool_loc != -1) {
    (*ctx->glUniform1iv)
              (pMVar1->vs_bool_loc,(GLsizei)pMVar1->vs_uniforms_bool_count,pMVar1->vs_uniforms_bool)
    ;
  }
  if (pMVar1->ps_float4_loc != -1) {
    (*ctx->glUniform4fv)
              (pMVar1->ps_float4_loc,(GLsizei)pMVar1->ps_uniforms_float4_count,
               pMVar1->ps_uniforms_float4);
  }
  if (pMVar1->ps_int4_loc != -1) {
    (*ctx->glUniform4iv)
              (pMVar1->ps_int4_loc,(GLsizei)pMVar1->ps_uniforms_int4_count,pMVar1->ps_uniforms_int4)
    ;
  }
  if (pMVar1->ps_bool_loc != -1) {
    (*ctx->glUniform1iv)
              (pMVar1->ps_bool_loc,(GLsizei)pMVar1->ps_uniforms_bool_count,pMVar1->ps_uniforms_bool)
    ;
    return;
  }
  return;
}

Assistant:

static void impl_GLSL_PushUniforms(void)
{
    const MOJOSHADER_glProgram *program = ctx->bound_program;

    assert(program->uniform_count > 0);  // don't call with nothing to do!

    if (program->vs_float4_loc != -1)
    {
        ctx->glUniform4fv(program->vs_float4_loc,
                          program->vs_uniforms_float4_count,
                          program->vs_uniforms_float4);
    } // if

    if (program->vs_int4_loc != -1)
    {
        ctx->glUniform4iv(program->vs_int4_loc,
                          program->vs_uniforms_int4_count,
                          program->vs_uniforms_int4);
    } // if

    if (program->vs_bool_loc != -1)
    {
        ctx->glUniform1iv(program->vs_bool_loc,
                          program->vs_uniforms_bool_count,
                          program->vs_uniforms_bool);
    } // if

    if (program->ps_float4_loc != -1)
    {
        ctx->glUniform4fv(program->ps_float4_loc,
                          program->ps_uniforms_float4_count,
                          program->ps_uniforms_float4);
    } // if

    if (program->ps_int4_loc != -1)
    {
        ctx->glUniform4iv(program->ps_int4_loc,
                          program->ps_uniforms_int4_count,
                          program->ps_uniforms_int4);
    } // if

    if (program->ps_bool_loc != -1)
    {
        ctx->glUniform1iv(program->ps_bool_loc,
                          program->ps_uniforms_bool_count,
                          program->ps_uniforms_bool);
    } // if
}